

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

int Bac_ManClpObjNum(Bac_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bac_Ntk_t *pBVar5;
  long lVar6;
  
  uVar1 = p->nNtks;
  if (0 < (int)uVar1) {
    pBVar5 = p->pNtks;
    lVar6 = 0;
    do {
      *(undefined4 *)((long)&pBVar5[1].Count + lVar6) = 0xffffffff;
      lVar6 = lVar6 + 0xd0;
    } while ((ulong)uVar1 * 0xd0 - lVar6 != 0);
  }
  lVar6 = (long)p->iRoot;
  iVar2 = p->pNtks[lVar6].vInputs.nSize;
  iVar3 = p->pNtks[lVar6].vOutputs.nSize;
  if (lVar6 < 1) {
    pBVar5 = (Bac_Ntk_t *)0x0;
  }
  else {
    pBVar5 = p->pNtks + lVar6;
  }
  iVar4 = Bac_ManClpObjNum_rec(pBVar5);
  return iVar4 + iVar3 + iVar2;
}

Assistant:

int Bac_ManClpObjNum( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        pNtk->Count = -1;
    return Bac_NtkPioNum( Bac_ManRoot(p) ) + Bac_ManClpObjNum_rec( Bac_ManRoot(p) );
}